

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadCustomSection
          (BinaryReader *this,Index section_index,Offset section_size)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  Result RVar4;
  int iVar5;
  size_type sVar6;
  Enum EVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  uint32_t uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  string_view name;
  Index num_names;
  uint32_t name_type;
  uint32_t value;
  Index num_locals;
  uint32_t table_align;
  uint32_t value_1;
  string_view section_name;
  uint local_a0;
  uint local_9c;
  string_view local_98;
  uint32_t local_7c;
  ulong local_78;
  uint local_70;
  uint local_6c;
  string_view local_68;
  uint local_4c;
  string_view local_48;
  uint local_38;
  uint local_34;
  
  local_48._M_len = 0;
  local_48._M_str = (char *)0x0;
  RVar4 = ReadStr(this,&local_48,"section name");
  pcVar9 = local_48._M_str;
  sVar3 = local_48._M_len;
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                    (this->delegate_,(ulong)section_index,section_size,local_48._M_len,
                     local_48._M_str);
  if (iVar5 != 0) {
    PrintError(this,"BeginCustomSection callback failed");
    return (Result)Error;
  }
  bVar1 = this->reading_custom_section_;
  this->reading_custom_section_ = true;
  if ((sVar3 == 4 & this->options_->read_debug_names) == 1) {
    if (*(int *)pcVar9 != 0x656d616e) goto LAB_00144eb8;
    iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa4])(this->delegate_,section_size);
    if (iVar5 == 0) {
      if ((this->state_).offset < this->read_end_) {
        uVar8 = 0;
        uVar13 = 0;
        do {
          RVar4 = ReadU32Leb128(this,&local_9c,"name type");
          uVar10 = local_9c;
          if (RVar4.enum_ == Error) goto LAB_0014554c;
          if ((int)uVar8 != 0) {
            if (local_9c == uVar13) {
              pcVar9 = "duplicate sub-section";
              goto LAB_00145542;
            }
            if (local_9c < uVar13) {
              pcVar9 = "out-of-order sub-section";
              goto LAB_00145542;
            }
          }
          RVar4 = ReadU32Leb128(this,(uint32_t *)&local_98,"subsection size");
          uVar13 = local_9c;
          if (RVar4.enum_ == Error) goto LAB_0014554c;
          local_34 = uVar10;
          uVar12 = local_98._M_len & 0xffffffff;
          uVar15 = (this->state_).offset + uVar12;
          uVar14 = this->read_end_;
          if (uVar14 < uVar15) {
            pcVar9 = "invalid sub-section size: extends past end";
            goto LAB_00145542;
          }
          this->read_end_ = uVar15;
          local_78 = uVar14;
          if (((int)local_9c < 0xb) &&
             (iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xae])
                                (this->delegate_,uVar8,(ulong)local_9c,uVar12), iVar5 != 0)) {
            pcVar9 = "OnNameSubsection callback failed";
LAB_00145672:
            PrintError(this,pcVar9);
            goto LAB_0014575f;
          }
          switch(uVar13) {
          case 0:
            iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa5])
                              (this->delegate_,uVar8,(ulong)local_9c,uVar12);
            if (iVar5 != 0) {
              pcVar9 = "OnModuleNameSubsection callback failed";
              goto LAB_00145672;
            }
            if (uVar12 != 0) {
              local_98._M_len = 0;
              local_98._M_str = (char *)0x0;
              RVar4 = ReadStr(this,&local_98,"module name");
              if (RVar4.enum_ == Error) goto LAB_0014575f;
              iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa6])
                                (this->delegate_,local_98._M_len,local_98._M_str);
              if (iVar5 != 0) {
                pcVar9 = "OnModuleName callback failed";
                goto LAB_00145672;
              }
            }
            break;
          case 1:
            iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa7])
                              (this->delegate_,uVar8,(ulong)local_9c,uVar12);
            if (iVar5 != 0) {
              pcVar9 = "OnFunctionNameSubsection callback failed";
              goto LAB_00145672;
            }
            if (uVar12 == 0) break;
            RVar4 = ReadCount(this,&local_a0,"name count");
            uVar13 = local_a0;
            if (RVar4.enum_ != Error) {
              iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa8])
                                (this->delegate_,(ulong)local_a0);
              if (iVar5 == 0) {
                if (uVar13 == 0) break;
                uVar10 = 0xffffffff;
                while( true ) {
                  local_98._M_len = 0;
                  local_98._M_str = (char *)0x0;
                  RVar4 = ReadU32Leb128(this,(uint32_t *)&local_68,"function index");
                  sVar3 = local_68._M_len;
                  if (RVar4.enum_ == Error) goto LAB_0014575f;
                  uVar2 = (uint)local_68._M_len;
                  if ((uint)local_68._M_len == uVar10) {
                    pcVar9 = "duplicate function name: %u";
                    local_68._M_len = (size_t)uVar10;
                    goto LAB_00145753;
                  }
                  if ((uint)local_68._M_len <= uVar10 && uVar10 != 0xffffffff) break;
                  if (this->num_function_signatures_ + this->num_func_imports_ <=
                      (uint)local_68._M_len) {
                    pcVar9 = "invalid function index: %u";
                    goto LAB_0014574d;
                  }
                  RVar4 = ReadStr(this,&local_98,"function name");
                  if (RVar4.enum_ == Error) goto LAB_0014575f;
                  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa9])
                                    (this->delegate_,sVar3 & 0xffffffff,local_98._M_len,
                                     local_98._M_str);
                  if (iVar5 != 0) {
                    pcVar9 = "OnFunctionName callback failed";
                    goto LAB_00145616;
                  }
                  uVar13 = uVar13 - 1;
                  uVar10 = uVar2;
                  if (uVar13 == 0) goto LAB_00145134;
                }
                pcVar9 = "function index out of order: %u";
LAB_0014574d:
                local_68._M_len = (size_t)(uint)local_68._M_len;
LAB_00145753:
                PrintError(this,pcVar9,local_68._M_len);
              }
              else {
                pcVar9 = "OnFunctionNamesCount callback failed";
LAB_00145616:
                PrintError(this,pcVar9);
              }
            }
            goto LAB_0014575f;
          case 2:
            iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaa])
                              (this->delegate_,uVar8,(ulong)local_9c,uVar12);
            if (iVar5 != 0) {
              pcVar9 = "OnLocalNameSubsection callback failed";
              goto LAB_00145672;
            }
            if (uVar12 != 0) {
              RVar4 = ReadCount(this,&local_a0,"function count");
              uVar13 = local_a0;
              if (RVar4.enum_ == Error) goto LAB_0014575f;
              iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xab])
                                (this->delegate_,(ulong)local_a0);
              if (iVar5 != 0) {
                pcVar9 = "OnLocalNameFunctionCount callback failed";
                goto LAB_00145672;
              }
              if (uVar13 != 0) {
                local_4c = 0;
                local_38 = uVar13;
                uVar13 = 0xffffffff;
                do {
                  RVar4 = ReadU32Leb128(this,(uint32_t *)&local_98,"function index");
                  if (RVar4.enum_ == Error) goto LAB_0014575f;
                  if (this->num_function_signatures_ + this->num_func_imports_ <=
                      (uint)local_98._M_len) {
                    pcVar9 = "invalid function index: %u";
LAB_00145818:
                    PrintError(this,pcVar9,local_98._M_len & 0xffffffff);
                    goto LAB_0014575f;
                  }
                  local_6c = (uint)local_98._M_len;
                  if ((uint)local_98._M_len <= uVar13 && uVar13 != 0xffffffff) {
                    pcVar9 = "locals function index out of order: %u";
                    goto LAB_00145818;
                  }
                  RVar4 = ReadCount(this,&local_7c,"local count");
                  uVar11 = local_7c;
                  if (RVar4.enum_ == Error) goto LAB_0014575f;
                  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xac])
                                    (this->delegate_,(ulong)local_6c,(ulong)local_7c);
                  if (iVar5 != 0) {
                    pcVar9 = "OnLocalNameLocalCount callback failed";
                    goto LAB_00145616;
                  }
                  if (uVar11 != 0) {
                    uVar13 = 0xffffffff;
                    do {
                      local_98._M_len = 0;
                      local_98._M_str = (char *)0x0;
                      RVar4 = ReadU32Leb128(this,(uint32_t *)&local_68,"named index");
                      sVar3 = local_68._M_len;
                      if (RVar4.enum_ == Error) goto LAB_0014575f;
                      uVar10 = (uint)local_68._M_len;
                      if ((uint)local_68._M_len == uVar13) {
                        pcVar9 = "duplicate local index: %u";
                        local_68._M_len._0_4_ = uVar13;
                        goto LAB_0014574d;
                      }
                      if ((uint)local_68._M_len <= uVar13 && uVar13 != 0xffffffff) {
                        pcVar9 = "local index out of order: %u";
                        local_68._M_len = local_68._M_len & 0xffffffff;
                        goto LAB_00145753;
                      }
                      RVar4 = ReadStr(this,&local_98,"name");
                      if (RVar4.enum_ == Error) goto LAB_0014575f;
                      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xad])
                                        (this->delegate_,(ulong)local_6c,sVar3 & 0xffffffff,
                                         local_98._M_len,local_98._M_str);
                      if (iVar5 != 0) {
                        pcVar9 = "OnLocalName callback failed";
                        goto LAB_00145616;
                      }
                      uVar11 = uVar11 - 1;
                      uVar13 = uVar10;
                    } while (uVar11 != 0);
                  }
                  local_4c = local_4c + 1;
                  uVar13 = local_6c;
                } while (local_4c != local_38);
              }
            }
            break;
          case 4:
          case 5:
          case 6:
          case 7:
          case 8:
          case 9:
          case 10:
            if (uVar12 != 0) {
              RVar4 = ReadCount(this,&local_a0,"name count");
              uVar10 = local_a0;
              if (RVar4.enum_ == Error) goto LAB_0014575f;
              iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xaf])
                                (this->delegate_,(ulong)local_a0);
              if (iVar5 != 0) {
                pcVar9 = "OnNameCount callback failed";
                goto LAB_00145672;
              }
              for (; uVar10 != 0; uVar10 = uVar10 - 1) {
                local_98._M_len = 0;
                local_98._M_str = (char *)0x0;
                RVar4 = ReadU32Leb128(this,(uint32_t *)&local_68,"index");
                sVar3 = local_68._M_len;
                if ((RVar4.enum_ == Error) ||
                   (RVar4 = ReadStr(this,&local_98,"name"), RVar4.enum_ == Error))
                goto LAB_0014575f;
                iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb0])
                                  (this->delegate_,(ulong)uVar13,sVar3 & 0xffffffff,local_98._M_len,
                                   local_98._M_str);
                if (iVar5 != 0) {
                  pcVar9 = "OnNameEntry callback failed";
                  goto LAB_00145616;
                }
              }
            }
          default:
            (this->state_).offset = uVar15;
          }
LAB_00145134:
          if ((this->state_).offset != uVar15) {
            PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar15);
LAB_0014575f:
            this->read_end_ = local_78;
            goto LAB_0014554c;
          }
          uVar8 = (ulong)((int)uVar8 + 1);
          this->read_end_ = local_78;
          uVar13 = local_34;
        } while (uVar15 < local_78);
      }
      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb1])();
      if (iVar5 != 0) {
        pcVar9 = "EndNamesSection callback failed";
        goto LAB_00145542;
      }
      this->did_read_names_section_ = true;
      goto LAB_00144f7e;
    }
    pcVar9 = "BeginNamesSection callback failed";
LAB_00145542:
    PrintError(this,pcVar9);
  }
  else {
    if (sVar3 != 6) {
      if ((sVar3 == 8) && (*(long *)pcVar9 == 0x302e6b6e696c7964)) {
        iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb6])(this->delegate_,section_size);
        if (iVar5 == 0) {
          if ((this->state_).offset < this->read_end_) {
LAB_00144b2a:
            RVar4 = ReadU32Leb128(this,&local_9c,"type");
            if ((RVar4.enum_ != Error) &&
               (RVar4 = ReadU32Leb128(this,(uint32_t *)&local_98,"subsection size"),
               RVar4.enum_ != Error)) {
              uVar14 = (local_98._M_len & 0xffffffff) + (this->state_).offset;
              uVar8 = this->read_end_;
              if (uVar8 < uVar14) {
                PrintError(this,"invalid sub-section size: extends past end");
                goto LAB_001457d7;
              }
              this->read_end_ = uVar14;
              switch(local_9c) {
              case 1:
                RVar4 = ReadU32Leb128(this,(uint32_t *)&local_98,"mem_size");
                if (((RVar4.enum_ != Error) &&
                    (RVar4 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_align"),
                    RVar4.enum_ != Error)) &&
                   ((RVar4 = ReadU32Leb128(this,&local_7c,"table_size"), RVar4.enum_ != Error &&
                    (RVar4 = ReadU32Leb128(this,&local_70,"table_align"), RVar4.enum_ != Error)))) {
                  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb7])
                                    (this->delegate_,local_98._M_len & 0xffffffff,
                                     local_68._M_len & 0xffffffff,(ulong)local_7c,(ulong)local_70);
                  if (iVar5 == 0) goto LAB_00144e55;
                  pcVar9 = "OnDylinkInfo callback failed";
LAB_001457ca:
                  PrintError(this,pcVar9);
                }
                break;
              case 2:
                RVar4 = ReadU32Leb128(this,&local_a0,"needed_dynlibs");
                if (RVar4.enum_ != Error) {
                  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])
                                    (this->delegate_,(ulong)local_a0);
                  if (iVar5 != 0) {
                    pcVar9 = "OnDylinkNeededCount callback failed";
                    goto LAB_001457ca;
                  }
                  while (bVar16 = local_a0 != 0, local_a0 = local_a0 - 1, bVar16) {
                    local_98._M_len = 0;
                    local_98._M_str = (char *)0x0;
                    RVar4 = ReadStr(this,&local_98,"dylib so_name");
                    if (RVar4.enum_ == Error) goto LAB_001457d4;
                    iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                      (this->delegate_,local_98._M_len,local_98._M_str);
                    if (iVar5 != 0) {
                      pcVar9 = "OnDylinkNeeded callback failed";
                      goto LAB_001457ca;
                    }
                  }
                  goto LAB_00144e55;
                }
                break;
              case 3:
                RVar4 = ReadU32Leb128(this,&local_a0,"count");
                if (RVar4.enum_ != Error) {
                  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb9])
                                    (this->delegate_,(ulong)local_a0);
                  if (iVar5 != 0) {
                    pcVar9 = "OnDylinkExportCount callback failed";
                    goto LAB_001457ca;
                  }
                  if (local_a0 != 0) {
                    uVar13 = 0;
                    do {
                      local_68._M_len = local_68._M_len & 0xffffffff00000000;
                      local_98._M_len = 0;
                      local_98._M_str = (char *)0x0;
                      RVar4 = ReadStr(this,&local_98,"name");
                      if ((RVar4.enum_ == Error) ||
                         (RVar4 = ReadU32Leb128(this,(uint32_t *)&local_68,"flags"),
                         RVar4.enum_ == Error)) goto LAB_001457d4;
                      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbb])
                                        (this->delegate_,local_98._M_len,local_98._M_str,
                                         local_68._M_len & 0xffffffff);
                      if (iVar5 != 0) {
                        pcVar9 = "OnDylinkExport callback failed";
                        goto LAB_001457ca;
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar13 < local_a0);
                  }
                  goto LAB_00144e55;
                }
                break;
              case 4:
                RVar4 = ReadU32Leb128(this,&local_a0,"count");
                if (RVar4.enum_ != Error) {
                  iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb8])
                                    (this->delegate_,(ulong)local_a0);
                  if (iVar5 != 0) {
                    pcVar9 = "OnDylinkImportCount callback failed";
                    goto LAB_001457ca;
                  }
                  if (local_a0 != 0) {
                    uVar13 = 0;
                    do {
                      local_7c = 0;
                      local_98._M_len = 0;
                      local_98._M_str = (char *)0x0;
                      local_68._M_len = 0;
                      local_68._M_str = (char *)0x0;
                      RVar4 = ReadStr(this,&local_98,"module");
                      if (((RVar4.enum_ == Error) ||
                          (RVar4 = ReadStr(this,&local_68,"field"), RVar4.enum_ == Error)) ||
                         (RVar4 = ReadU32Leb128(this,&local_7c,"flags"), RVar4.enum_ == Error))
                      goto LAB_001457d4;
                      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xba])
                                        (this->delegate_,local_98._M_len,local_98._M_str,
                                         local_68._M_len,local_68._M_str,(ulong)local_7c);
                      if (iVar5 != 0) {
                        pcVar9 = "OnDylinkImport callback failed";
                        goto LAB_001457ca;
                      }
                      uVar13 = uVar13 + 1;
                    } while (uVar13 < local_a0);
                  }
                  goto LAB_00144e55;
                }
                break;
              default:
                (this->state_).offset = uVar14;
LAB_00144e55:
                if ((this->state_).offset != uVar14) {
                  PrintError(this,"unfinished sub-section (expected end: 0x%zx)",uVar14);
                  break;
                }
                this->read_end_ = uVar8;
                if (uVar8 <= uVar14) goto LAB_00144e77;
                goto LAB_00144b2a;
              }
LAB_001457d4:
              this->read_end_ = uVar8;
            }
LAB_001457d7:
            EVar7 = Error;
            goto LAB_00145551;
          }
LAB_00144e77:
          iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])();
          if (iVar5 == 0) goto LAB_00144f7e;
LAB_00144e91:
          pcVar9 = "EndDylinkSection callback failed";
          goto LAB_00145542;
        }
LAB_001454eb:
        pcVar9 = "BeginDylinkSection callback failed";
        goto LAB_00145542;
      }
LAB_00144eb8:
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::rfind(&local_48,"reloc",0,5);
      if (sVar6 == 0) {
        RVar4 = ReadRelocSection(this,section_size);
      }
      else if (local_48._M_len == 7) {
        if (*(int *)((long)local_48._M_str + 3) != 0x676e696b ||
            *(int *)local_48._M_str != 0x6b6e696c) goto LAB_00144f49;
        RVar4 = ReadLinkingSection(this,section_size);
      }
      else if ((local_48._M_len == 0xf) &&
              (*(long *)((long)local_48._M_str + 7) == 0x7365727574616566 &&
               *(long *)local_48._M_str == 0x665f746567726174)) {
        RVar4 = ReadTargetFeaturesSections(this,section_size);
      }
      else {
LAB_00144f49:
        if (((this->options_->features).code_metadata_enabled_ != true) ||
           (sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              (&local_48,"metadata.code.",0,0xe), sVar6 != 0)) {
          (this->state_).offset = this->read_end_;
          goto LAB_00144f7e;
        }
        name._M_str = (char *)((long)local_48._M_str + 0xe);
        name._M_len = local_48._M_len - 0xe;
        RVar4 = ReadCodeMetadataSection(this,name,section_size);
      }
      EVar7 = Error;
      if (RVar4.enum_ == Error) goto LAB_00145551;
LAB_00144f7e:
      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
      if (iVar5 == 0) {
        EVar7 = Ok;
        goto LAB_00145551;
      }
      pcVar9 = "EndCustomSection callback failed";
      goto LAB_00145542;
    }
    if (*(short *)((long)pcVar9 + 4) != 0x6b6e || *(int *)pcVar9 != 0x696c7964) goto LAB_00144eb8;
    iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb6])(this->delegate_,section_size);
    if (iVar5 != 0) goto LAB_001454eb;
    RVar4 = ReadU32Leb128(this,(uint32_t *)&local_68,"mem_size");
    if ((((RVar4.enum_ != Error) &&
         (RVar4 = ReadU32Leb128(this,&local_9c,"mem_align"), RVar4.enum_ != Error)) &&
        (RVar4 = ReadU32Leb128(this,&local_a0,"table_size"), RVar4.enum_ != Error)) &&
       (RVar4 = ReadU32Leb128(this,&local_7c,"table_align"), RVar4.enum_ != Error)) {
      iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb7])
                        (this->delegate_,local_68._M_len & 0xffffffff,(ulong)local_9c,
                         (ulong)local_a0,(ulong)local_7c);
      if (iVar5 == 0) {
        RVar4 = ReadU32Leb128(this,&local_70,"needed_dynlibs");
        if (RVar4.enum_ == Error) goto LAB_0014554c;
        iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbc])
                          (this->delegate_,(ulong)local_70);
        if (iVar5 == 0) {
          bVar16 = local_70 != 0;
          local_70 = local_70 - 1;
          if (bVar16) {
            do {
              local_98._M_len = 0;
              local_98._M_str = (char *)0x0;
              RVar4 = ReadStr(this,&local_98,"dylib so_name");
              if (RVar4.enum_ == Error) goto LAB_0014554c;
              iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbd])
                                (this->delegate_,local_98._M_len,local_98._M_str);
              if (iVar5 != 0) {
                pcVar9 = "OnDylinkNeeded callback failed";
                goto LAB_00145542;
              }
              bVar16 = local_70 != 0;
              local_70 = local_70 - 1;
            } while (bVar16);
          }
          iVar5 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbe])();
          if (iVar5 != 0) goto LAB_00144e91;
          goto LAB_00144f7e;
        }
        pcVar9 = "OnDylinkNeededCount callback failed";
      }
      else {
        pcVar9 = "OnDylinkInfo callback failed";
      }
      goto LAB_00145542;
    }
  }
LAB_0014554c:
  EVar7 = Error;
LAB_00145551:
  this->reading_custom_section_ = bVar1;
  return (Result)EVar7;
}

Assistant:

Result BinaryReader::ReadCustomSection(Index section_index,
                                       Offset section_size) {
  std::string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_index, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK0) {
    CHECK_RESULT(ReadDylink0Section(section_size));
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_TARGET_FEATURES) {
    CHECK_RESULT(ReadTargetFeaturesSections(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else if (options_.features.code_metadata_enabled() &&
             section_name.find(WABT_BINARY_SECTION_CODE_METADATA) == 0) {
    std::string_view metadata_name = section_name;
    metadata_name.remove_prefix(sizeof(WABT_BINARY_SECTION_CODE_METADATA) - 1);
    CHECK_RESULT(ReadCodeMetadataSection(metadata_name, section_size));
  } else {
    // This is an unknown custom section, skip it.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}